

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bluetooth_packet.c
# Opt level: O0

int btbb_decode_payload(btbb_packet *pkt)

{
  int local_14;
  int rv;
  btbb_packet *pkt_local;
  
  local_14 = 0;
  pkt->payload_header_length = 0;
  switch(pkt->packet_type) {
  case '\0':
    pkt->payload_length = 0;
    local_14 = 1;
    break;
  case '\x01':
    pkt->payload_length = 0;
    local_14 = 1;
    break;
  case '\x02':
    local_14 = fhs(pkt->clock,pkt);
    break;
  case '\x03':
    local_14 = DM(pkt->clock,pkt);
    break;
  case '\x04':
    local_14 = DH(pkt->clock,pkt);
    break;
  case '\x05':
    local_14 = HV(pkt->clock,pkt);
    break;
  case '\x06':
    local_14 = HV(pkt->clock,pkt);
    break;
  case '\a':
    local_14 = EV3(pkt->clock,pkt);
    if (local_14 < 2) {
      local_14 = HV(pkt->clock,pkt);
    }
    break;
  case '\b':
    local_14 = DM(pkt->clock,pkt);
    break;
  case '\t':
    local_14 = DH(pkt->clock,pkt);
    break;
  case '\n':
    local_14 = DM(pkt->clock,pkt);
    break;
  case '\v':
    local_14 = DH(pkt->clock,pkt);
    break;
  case '\f':
    local_14 = EV4(pkt->clock,pkt);
    break;
  case '\r':
    local_14 = EV5(pkt->clock,pkt);
    break;
  case '\x0e':
    local_14 = DM(pkt->clock,pkt);
    break;
  case '\x0f':
    local_14 = DH(pkt->clock,pkt);
  }
  btbb_packet_set_flag(pkt,7,1);
  return local_14;
}

Assistant:

int btbb_decode_payload(btbb_packet* pkt)
{
	int rv = 0;
	pkt->payload_header_length = 0;

	switch(pkt->packet_type)
	{
		case PACKET_TYPE_NULL:
			/* no payload to decode */
			pkt->payload_length = 0;
			rv = 1;
			break;
		case PACKET_TYPE_POLL:
			/* no payload to decode */
			pkt->payload_length = 0;
			rv = 1;
			break;
		case PACKET_TYPE_FHS:
			rv = fhs(pkt->clock, pkt);
			break;
		case PACKET_TYPE_DM1:
			rv = DM(pkt->clock, pkt);
			break;
		case PACKET_TYPE_DH1:
			/* assuming DH1 but could be 2-DH1 */
			rv = DH(pkt->clock, pkt);
			break;
		case PACKET_TYPE_HV1:
			rv = HV(pkt->clock, pkt);
			break;
		case PACKET_TYPE_HV2:
			rv = HV(pkt->clock, pkt);
			break;
		case PACKET_TYPE_HV3: /* HV3/EV3/3-EV3 */
			/* decode as EV3 if CRC checks out */
			if ((rv = EV3(pkt->clock, pkt)) <= 1)
				/* otherwise assume HV3 */
				rv = HV(pkt->clock, pkt);
			/* don't know how to decode 3-EV3 */
			break;
		case PACKET_TYPE_DV:
			/* assuming DV but could be 3-DH1 */
			rv = DM(pkt->clock, pkt);
			break;
		case PACKET_TYPE_AUX1:
			rv = DH(pkt->clock, pkt);
			break;
		case PACKET_TYPE_DM3:
			/* assuming DM3 but could be 2-DH3 */
			rv = DM(pkt->clock, pkt);
			break;
		case PACKET_TYPE_DH3:
			/* assuming DH3 but could be 3-DH3 */
			rv = DH(pkt->clock, pkt);
			break;
		case PACKET_TYPE_EV4:
			/* assuming EV4 but could be 2-EV5 */
			rv = EV4(pkt->clock, pkt);
			break;
		case PACKET_TYPE_EV5:
			/* assuming EV5 but could be 3-EV5 */
			rv = EV5(pkt->clock, pkt);
			break;
		case PACKET_TYPE_DM5:
			/* assuming DM5 but could be 2-DH5 */
			rv = DM(pkt->clock, pkt);
			break;
		case PACKET_TYPE_DH5:
			/* assuming DH5 but could be 3-DH5 */
			rv = DH(pkt->clock, pkt);
			break;
	}
	btbb_packet_set_flag(pkt, BTBB_HAS_PAYLOAD, 1);
	return rv;
}